

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio>::handle_terminate
          (connection<websocketpp::config::asio> *this,terminate_status tstat,error_code *ec)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  error_code *in_RCX;
  undefined1 local_98 [40];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [64];
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"connection handle_terminate",(size_t)in_RCX);
  }
  if (ec->_M_value != 0) {
    log_err<std::error_code>(this,1,"handle_terminate",ec);
    in_RCX = ec;
  }
  if (tstat == closed) {
    if ((this->m_close_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x10),
                 &(this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
      std::function<void_(std::weak_ptr<void>)>::operator()
                (&this->m_close_handler,(weak_ptr<void> *)(local_98 + 0x10));
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x18));
    }
    log_close_result(this);
  }
  else if (tstat == failed) {
    std::error_code::error_code<websocketpp::error::value,void>
              ((error_code *)local_68,http_connection_ended);
    if (((this->m_ec)._M_cat != (error_category *)local_68._8_8_ ||
         (this->m_ec)._M_value != local_68._0_4_) &&
       ((this->m_fail_handler).super__Function_base._M_manager != (_Manager_type)0x0)) {
      std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x20),
                 &(this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
      std::function<void_(std::weak_ptr<void>)>::operator()
                (&this->m_fail_handler,(weak_ptr<void> *)(local_98 + 0x20));
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_70);
    }
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x10,"Unknown terminate_status",(size_t)in_RCX);
  }
  if ((this->m_termination_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
    get_shared((connection<websocketpp::config::asio> *)local_98);
    std::function<void_(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>)>::
    operator()(&this->m_termination_handler,
               (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  }
  return;
}

Assistant:

void connection<config>::handle_terminate(terminate_status tstat,
    lib::error_code const & ec)
{
    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"connection handle_terminate");
    }

    if (ec) {
        // there was an error actually shutting down the connection
        log_err(log::elevel::devel,"handle_terminate",ec);
    }

    // clean shutdown
    if (tstat == failed) {
        if (m_ec != error::http_connection_ended) {
            if (m_fail_handler) {
                m_fail_handler(m_connection_hdl);
            }
        }
    } else if (tstat == closed) {
        if (m_close_handler) {
            m_close_handler(m_connection_hdl);
        }
        log_close_result();
    } else {
        m_elog->write(log::elevel::rerror,"Unknown terminate_status");
    }

    // call the termination handler if it exists
    // if it exists it might (but shouldn't) refer to a bad memory location.
    // If it does, we don't care and should catch and ignore it.
    if (m_termination_handler) {
        try {
            m_termination_handler(type::get_shared());
        } catch (std::exception const & e) {
            m_elog->write(log::elevel::warn,
                std::string("termination_handler call failed. Reason was: ")+e.what());
        }
    }
}